

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

void boost::unordered::detail::foa::
     table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
     ::delete_(allocator_type al,
              table_arrays<const_slang::ast::ValueSymbol_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>_>
              *arrays)

{
  allocator_type sal;
  StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL> local_8;
  
  if (arrays->elements_ != (ValueSymbol **)0x0) {
    local_8.storage = al.storage;
    slang::detail::hashing::StackAllocator<const_slang::ast::ValueSymbol_*,_64UL,_16UL>::deallocate
              (&local_8,arrays->elements_,arrays->groups_size_mask * 0x88 + 0x96 >> 3);
  }
  return;
}

Assistant:

static void delete_(allocator_type al, table_arrays& arrays) noexcept {
        using storage_traits = std::allocator_traits<allocator_type>;

        auto sal = allocator_type(al);
        if (arrays.elements()) {
            storage_traits::deallocate(sal, arrays.elements_,
                                       buffer_size(arrays.groups_size_mask + 1));
        }
    }